

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O3

image * __thiscall basisu::image::operator=(image *this,image *rhs)

{
  color_rgba_vec *pcVar1;
  color_rgba *__src;
  uint32_t uVar2;
  uint uVar3;
  
  if (this != rhs) {
    uVar2 = rhs->m_height;
    this->m_width = rhs->m_width;
    this->m_height = uVar2;
    this->m_pitch = rhs->m_pitch;
    pcVar1 = &this->m_pixels;
    uVar3 = (rhs->m_pixels).m_size;
    if ((this->m_pixels).m_capacity < uVar3) {
      if (pcVar1->m_p != (color_rgba *)0x0) {
        free(pcVar1->m_p);
        pcVar1->m_p = (color_rgba *)0x0;
        (this->m_pixels).m_size = 0;
        (this->m_pixels).m_capacity = 0;
        uVar3 = (rhs->m_pixels).m_size;
      }
      basisu::elemental_vector::increase_capacity
                ((uint)pcVar1,SUB41(uVar3,0),0,(_func_void_void_ptr_void_ptr_uint *)0x4,false);
    }
    else if ((this->m_pixels).m_size != 0) {
      (this->m_pixels).m_size = 0;
    }
    if ((pcVar1->m_p != (color_rgba *)0x0) &&
       (__src = (rhs->m_pixels).m_p, __src != (color_rgba *)0x0)) {
      memcpy(pcVar1->m_p,__src,(ulong)(rhs->m_pixels).m_size << 2);
    }
    (this->m_pixels).m_size = (rhs->m_pixels).m_size;
  }
  return this;
}

Assistant:

image &operator= (const image &rhs)
		{
			if (this != &rhs)
			{
				m_width = rhs.m_width;
				m_height = rhs.m_height;
				m_pitch = rhs.m_pitch;
				m_pixels = rhs.m_pixels;
			}
			return *this;
		}